

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo(BayesianGameWithClusterInfo *this)

{
  bool bVar1;
  reference ppvVar2;
  reference ppTVar3;
  __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  *in_RDI;
  iterator last2;
  iterator it2;
  TypeClusterList *aohl;
  iterator last1;
  iterator it1;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *in_stack_ffffffffffffffa8;
  TypeCluster *in_stack_ffffffffffffffb0;
  __normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
  in_stack_ffffffffffffffc0;
  iterator in_stack_ffffffffffffffd0;
  __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
  local_28;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *local_20;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> **local_18;
  __normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
  local_10 [2];
  
  in_RDI->_M_current = (TypeCluster **)&PTR__BayesianGameWithClusterInfo_00d06ad0;
  in_RDI[4]._M_current = (TypeCluster **)&PTR__BayesianGameWithClusterInfo_00d06b20;
  local_10[0]._M_current =
       (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> **)
       std::
       vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
       ::begin((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                *)in_stack_ffffffffffffffa8);
  local_18 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> **)
             std::
             vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             ::end((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
              ::operator*(local_10);
    local_20 = *ppvVar2;
    local_28._M_current =
         (TypeCluster **)
         std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::begin
                   (in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffd0 =
         std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::end(in_stack_ffffffffffffffa8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
                ::operator*(&local_28);
      in_stack_ffffffffffffffb0 = *ppTVar3;
      if (in_stack_ffffffffffffffb0 != (TypeCluster *)0x0) {
        TypeCluster::~TypeCluster((TypeCluster *)in_stack_ffffffffffffffd0._M_current);
        operator_delete(in_stack_ffffffffffffffb0,0x38);
      }
      __gnu_cxx::
      __normal_iterator<TypeCluster_**,_std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_>
      ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
    in_stack_ffffffffffffffa8 = local_20;
    if (local_20 != (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)0x0) {
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::~vector
                ((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)
                 in_stack_ffffffffffffffc0._M_current);
      operator_delete(in_stack_ffffffffffffffa8,0x18);
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
         ::operator++((__normal_iterator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_**,_std::vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>_>
                       *)in_RDI,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
             *)in_stack_ffffffffffffffc0._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffffc0._M_current);
  boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)0x8bc0b7);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8bc0c8);
  BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage
            ((BayesianGameForDecPOMDPStage *)in_stack_ffffffffffffffd0._M_current);
  return;
}

Assistant:

BayesianGameWithClusterInfo::~BayesianGameWithClusterInfo()
{
    //free all the type information:
    std::vector< TypeClusterList* >::iterator it1 =  _m_typeLists.begin();
    std::vector< TypeClusterList* >::iterator last1 =  _m_typeLists.end();
    while(it1 != last1)
    {
        TypeClusterList* aohl = *it1;
        //TypeClusterList defined as std::vector<TypeCluster* > 
         std::vector<TypeCluster* >::iterator it2 = aohl->begin();
         std::vector<TypeCluster* >::iterator last2 = aohl->end();
         while(it2 != last2)
         {
             delete *it2;
             it2++;
         }            
        delete aohl;
        it1++;
    }
}